

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void run_ecdh_bench(int iters,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char **argv_00;
  int in_ESI;
  int d;
  bench_ecdh_data data;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa0;
  _func_void_void_ptr_int *in_stack_ffffffffffffffa8;
  _func_void_void_ptr *in_stack_ffffffffffffffb0;
  _func_void_void_ptr_int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  
  uVar1 = (uint)(in_ESI == 1);
  argv_00 = (char **)secp256k1_context_create(1);
  if (uVar1 == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffff90,argv_00,(char *)(ulong)in_stack_ffffffffffffff80);
    if (iVar2 == 0) goto LAB_00103f82;
  }
  run_benchmark(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                in_stack_ffffffffffffffd0);
LAB_00103f82:
  secp256k1_context_destroy(argv_00);
  return;
}

Assistant:

static void run_ecdh_bench(int iters, int argc, char** argv) {
    bench_ecdh_data data;
    int d = argc == 1;

    /* create a context with no capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_FLAGS_TYPE_CONTEXT);

    if (d || have_flag(argc, argv, "ecdh")) run_benchmark("ecdh", bench_ecdh, bench_ecdh_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}